

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::InitializeStaticValues(JavascriptLibrary *this)

{
  RecyclableObject **ppRVar1;
  JavascriptFunction **ppJVar2;
  JavascriptString *pJVar3;
  nullptr_t local_20;
  uint local_14;
  JavascriptLibrary *pJStack_10;
  TypeId typeId;
  JavascriptLibrary *this_local;
  
  pJStack_10 = this;
  Memory::WriteBarrierPtr<Js::ConstructorCache>::operator=
            (&this->constructorCacheDefaultInstance,
             (ConstructorCache *)ConstructorCache::DefaultInstance);
  Memory::WriteBarrierPtr<const_unsigned_char>::operator=
            (&this->absDoubleCst,NumberConstants::AbsDoubleCst);
  Memory::WriteBarrierPtr<const_double>::operator=
            (&this->uintConvertConst,NumberConstants::UIntConvertConst);
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).undefinedValue);
  PropertyDescriptor::SetValue(&this->defaultPropertyDescriptor,*ppRVar1);
  PropertyDescriptor::SetWritable(&this->defaultPropertyDescriptor,false);
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).defaultAccessorFunction);
  PropertyDescriptor::SetGetter(&this->defaultPropertyDescriptor,*ppJVar2);
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).defaultAccessorFunction);
  PropertyDescriptor::SetSetter(&this->defaultPropertyDescriptor,*ppJVar2);
  PropertyDescriptor::SetEnumerable(&this->defaultPropertyDescriptor,false);
  PropertyDescriptor::SetConfigurable(&this->defaultPropertyDescriptor,false);
  this->vtableAddresses[0] = 0;
  VirtualTableRecorder<Js::DynamicObject>::RecordVirtualTableAddress(this->vtableAddresses,1);
  this->vtableAddresses[2] = 1;
  VirtualTableRecorder<Js::PropertyString>::RecordVirtualTableAddress(this->vtableAddresses,3);
  VirtualTableRecorder<Js::LazyJSONString>::RecordVirtualTableAddress(this->vtableAddresses,4);
  VirtualTableRecorder<Js::JavascriptBoolean>::RecordVirtualTableAddress(this->vtableAddresses,6);
  VirtualTableRecorder<Js::JavascriptArray>::RecordVirtualTableAddress(this->vtableAddresses,7);
  VirtualTableRecorder<Js::TypedArray<char,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,8);
  VirtualTableRecorder<Js::TypedArray<unsigned_char,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,9);
  VirtualTableRecorder<Js::TypedArray<unsigned_char,_true,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,10);
  VirtualTableRecorder<Js::TypedArray<short,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0xb);
  VirtualTableRecorder<Js::TypedArray<unsigned_short,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0xc);
  VirtualTableRecorder<Js::TypedArray<int,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0xd);
  VirtualTableRecorder<Js::TypedArray<unsigned_int,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0xe);
  VirtualTableRecorder<Js::TypedArray<float,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0xf);
  VirtualTableRecorder<Js::TypedArray<double,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x10);
  VirtualTableRecorder<Js::TypedArray<long,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x12);
  VirtualTableRecorder<Js::TypedArray<unsigned_long,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x13);
  VirtualTableRecorder<Js::TypedArray<char,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x16);
  VirtualTableRecorder<Js::TypedArray<unsigned_char,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x17);
  VirtualTableRecorder<Js::TypedArray<unsigned_char,_true,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x18);
  VirtualTableRecorder<Js::TypedArray<short,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x19);
  VirtualTableRecorder<Js::TypedArray<unsigned_short,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x1a);
  VirtualTableRecorder<Js::TypedArray<int,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x1b);
  VirtualTableRecorder<Js::TypedArray<unsigned_int,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x1c);
  VirtualTableRecorder<Js::TypedArray<float,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x1d);
  VirtualTableRecorder<Js::TypedArray<double,_false,_true>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x1e);
  VirtualTableRecorder<Js::TypedArray<bool,_false,_false>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x14);
  VirtualTableRecorder<Js::CharArray>::RecordVirtualTableAddress(this->vtableAddresses,0x15);
  VirtualTableRecorder<Js::JavascriptNativeIntArray>::RecordVirtualTableAddress
            (this->vtableAddresses,0x1f);
  VirtualTableRecorder<Js::JavascriptCopyOnAccessNativeIntArray>::RecordVirtualTableAddress
            (this->vtableAddresses,0x20);
  VirtualTableRecorder<Js::JavascriptNativeFloatArray>::RecordVirtualTableAddress
            (this->vtableAddresses,0x21);
  this->vtableAddresses[0x22] = VirtualTableInfo<Js::JavascriptNativeIntArray>::Address;
  VirtualTableRecorder<Js::JavascriptRegExp>::RecordVirtualTableAddress(this->vtableAddresses,0x23);
  VirtualTableRecorder<Js::StackScriptFunction>::RecordVirtualTableAddress
            (this->vtableAddresses,0x2e);
  VirtualTableRecorder<Js::ScriptFunction>::RecordVirtualTableAddress(this->vtableAddresses,0x24);
  VirtualTableRecorder<Js::JavascriptGeneratorFunction>::RecordVirtualTableAddress
            (this->vtableAddresses,0x28);
  VirtualTableRecorder<Js::JavascriptAsyncFunction>::RecordVirtualTableAddress
            (this->vtableAddresses,0x2c);
  VirtualTableRecorder<Js::JavascriptAsyncGeneratorFunction>::RecordVirtualTableAddress
            (this->vtableAddresses,0x2d);
  VirtualTableRecorder<Js::FunctionWithComputedName<Js::AsmJsScriptFunction>_>::
  RecordVirtualTableAddress(this->vtableAddresses,0x2f);
  VirtualTableRecorder<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x25);
  VirtualTableRecorder<Js::FunctionWithComputedName<Js::ScriptFunction>_>::RecordVirtualTableAddress
            (this->vtableAddresses,0x26);
  VirtualTableRecorder<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_>_>
  ::RecordVirtualTableAddress(this->vtableAddresses,0x27);
  VirtualTableRecorder<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::
  RecordVirtualTableAddress(this->vtableAddresses,0x30);
  VirtualTableRecorder<Js::FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>_>::
  RecordVirtualTableAddress(this->vtableAddresses,0x31);
  VirtualTableRecorder<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>_>
  ::RecordVirtualTableAddress(this->vtableAddresses,0x32);
  VirtualTableRecorder<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>::
  RecordVirtualTableAddress(this->vtableAddresses,0x29);
  VirtualTableRecorder<Js::FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>_>::
  RecordVirtualTableAddress(this->vtableAddresses,0x2a);
  VirtualTableRecorder<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>_>
  ::RecordVirtualTableAddress(this->vtableAddresses,0x2b);
  VirtualTableRecorder<Js::ConcatStringMulti>::RecordVirtualTableAddress(this->vtableAddresses,0x33)
  ;
  VirtualTableRecorder<Js::CompoundString>::RecordVirtualTableAddress(this->vtableAddresses,0x34);
  for (local_14 = 0; (int)local_14 < 0x58; local_14 = local_14 + 1) {
    switch(local_14) {
    case 0:
      pJVar3 = GetUndefinedDisplayString(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,pJVar3);
      break;
    default:
      pJVar3 = GetObjectTypeDisplayString(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,pJVar3);
      break;
    case 2:
      pJVar3 = GetBooleanTypeDisplayString(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,pJVar3);
      break;
    case 3:
    case 4:
    case 5:
    case 6:
      pJVar3 = GetNumberTypeDisplayString(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,pJVar3);
      break;
    case 7:
      pJVar3 = GetStringTypeDisplayString(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,pJVar3);
      break;
    case 8:
      pJVar3 = GetSymbolTypeDisplayString(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,pJVar3);
      break;
    case 10:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x54:
      local_20 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,&local_20);
      break;
    case 0x1b:
      pJVar3 = GetFunctionTypeDisplayString(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (this->typeDisplayStrings + local_14,pJVar3);
    }
  }
  return;
}

Assistant:

void JavascriptLibrary::InitializeStaticValues()
    {
        constructorCacheDefaultInstance = &Js::ConstructorCache::DefaultInstance;
        absDoubleCst = Js::JavascriptNumber::AbsDoubleCst;
        uintConvertConst = Js::JavascriptNumber::UIntConvertConst;

        defaultPropertyDescriptor.SetValue(undefinedValue);
        defaultPropertyDescriptor.SetWritable(false);
        defaultPropertyDescriptor.SetGetter(defaultAccessorFunction);
        defaultPropertyDescriptor.SetSetter(defaultAccessorFunction);
        defaultPropertyDescriptor.SetEnumerable(false);
        defaultPropertyDescriptor.SetConfigurable(false);

#if !defined(TARGET_64)

        VirtualTableRecorder<Js::JavascriptNumber>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableJavascriptNumber);
#else
        vtableAddresses[VTableValue::VtableJavascriptNumber] = 0;
#endif
        VirtualTableRecorder<Js::DynamicObject>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableDynamicObject);
        vtableAddresses[VTableValue::VtableInvalid] = Js::ScriptContextOptimizationOverrideInfo::InvalidVtable;
        VirtualTableRecorder<Js::PropertyString>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtablePropertyString);
        VirtualTableRecorder<Js::LazyJSONString>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableLazyJSONString);
        VirtualTableRecorder<Js::JavascriptBoolean>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableJavascriptBoolean);
        VirtualTableRecorder<Js::JavascriptArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableJavascriptArray);
        VirtualTableRecorder<Js::Int8Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableInt8Array);
        VirtualTableRecorder<Js::Uint8Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint8Array);
        VirtualTableRecorder<Js::Uint8ClampedArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint8ClampedArray);
        VirtualTableRecorder<Js::Int16Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableInt16Array);
        VirtualTableRecorder<Js::Uint16Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint16Array);
        VirtualTableRecorder<Js::Int32Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableInt32Array);
        VirtualTableRecorder<Js::Uint32Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint32Array);
        VirtualTableRecorder<Js::Float32Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableFloat32Array);
        VirtualTableRecorder<Js::Float64Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableFloat64Array);
        VirtualTableRecorder<Js::Int64Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableInt64Array);
        VirtualTableRecorder<Js::Uint64Array>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint64Array);

        VirtualTableRecorder<Js::Int8VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableInt8VirtualArray);
        VirtualTableRecorder<Js::Uint8VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint8VirtualArray);
        VirtualTableRecorder<Js::Uint8ClampedVirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint8ClampedVirtualArray);
        VirtualTableRecorder<Js::Int16VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableInt16VirtualArray);
        VirtualTableRecorder<Js::Uint16VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint16VirtualArray);
        VirtualTableRecorder<Js::Int32VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableInt32VirtualArray);
        VirtualTableRecorder<Js::Uint32VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableUint32VirtualArray);
        VirtualTableRecorder<Js::Float32VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableFloat32VirtualArray);
        VirtualTableRecorder<Js::Float64VirtualArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableFloat64VirtualArray);

        VirtualTableRecorder<Js::BoolArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableBoolArray);
        VirtualTableRecorder<Js::CharArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableCharArray);

        VirtualTableRecorder<Js::JavascriptNativeIntArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableNativeIntArray);
#if ENABLE_COPYONACCESS_ARRAY
        VirtualTableRecorder<Js::JavascriptCopyOnAccessNativeIntArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableCopyOnAccessNativeIntArray);
#endif
        VirtualTableRecorder<Js::JavascriptNativeFloatArray>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableNativeFloatArray);
        // don't validate vtable for VtableJavascriptNativeIntArray because its vtable is used for VtableNativeIntArray
        vtableAddresses[VTableValue::VtableJavascriptNativeIntArray] = VirtualTableInfo<Js::JavascriptNativeIntArray>::Address;
        VirtualTableRecorder<Js::JavascriptRegExp>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableJavascriptRegExp);
        VirtualTableRecorder<Js::StackScriptFunction>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableStackScriptFunction);
        VirtualTableRecorder<Js::ScriptFunction>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableScriptFunction);
        VirtualTableRecorder<Js::JavascriptGeneratorFunction>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableJavascriptGeneratorFunction);
        VirtualTableRecorder<Js::JavascriptAsyncFunction>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableJavascriptAsyncFunction);
        VirtualTableRecorder<Js::JavascriptAsyncGeneratorFunction>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableJavascriptAsyncGeneratorFunction);

        // ScriptFunction
        VirtualTableRecorder<Js::FunctionWithComputedName<Js::AsmJsScriptFunction>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableAsmJsScriptFunctionWithComputedName);
        VirtualTableRecorder<Js::FunctionWithHomeObj<Js::ScriptFunction>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableScriptFunctionWithHomeObj);
        VirtualTableRecorder<Js::FunctionWithComputedName<Js::ScriptFunction>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableScriptFunctionWithComputedName);
        VirtualTableRecorder<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableScriptFunctionWithHomeObjAndComputedName);
        VirtualTableRecorder<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableScriptFunctionWithInlineCacheAndHomeObj);
        VirtualTableRecorder<Js::FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableScriptFunctionWithInlineCacheAndComputedName);
        VirtualTableRecorder<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableScriptFunctionWithInlineCacheHomeObjAndComputedName);
        VirtualTableRecorder<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableVirtualJavascriptGeneratorFunctionWithHomeObj);
        VirtualTableRecorder<Js::FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableVirtualJavascriptGeneratorFunctionWithComputedName);
        VirtualTableRecorder<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableVirtualJavascriptGeneratorFunctionWithHomeObjAndComputedName);

        VirtualTableRecorder<Js::ConcatStringMulti>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableConcatStringMulti);
        VirtualTableRecorder<Js::CompoundString>::RecordVirtualTableAddress(vtableAddresses, VTableValue::VtableCompoundString);

        for (TypeId typeId = static_cast<TypeId>(0); typeId < TypeIds_Limit; typeId = static_cast<TypeId>(typeId + 1))
        {
            switch (typeId)
            {
            case TypeIds_Undefined:
                typeDisplayStrings[typeId] = GetUndefinedDisplayString();
                break;

            case TypeIds_Function:
                typeDisplayStrings[typeId] = GetFunctionTypeDisplayString();
                break;

            case TypeIds_Boolean:
                typeDisplayStrings[typeId] = GetBooleanTypeDisplayString();
                break;

            case TypeIds_String:
                typeDisplayStrings[typeId] = GetStringTypeDisplayString();
                break;

            case TypeIds_Symbol:
                typeDisplayStrings[typeId] = GetSymbolTypeDisplayString();
                break;

            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Int64Number:
            case TypeIds_UInt64Number:
                typeDisplayStrings[typeId] = GetNumberTypeDisplayString();
                break;

            case TypeIds_Enumerator:
            case TypeIds_HostDispatch:
            case TypeIds_UnscopablesWrapperObject:
            case TypeIds_UndeclBlockVar:
            case TypeIds_Proxy:
            case TypeIds_SpreadArgument:
                typeDisplayStrings[typeId] = nullptr;
                break;

            default:
                typeDisplayStrings[typeId] = GetObjectTypeDisplayString();
                break;
            }
        }
    }